

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopCheaperProperSubset(WhereLoop *pX,WhereLoop *pY)

{
  int j;
  int i;
  WhereLoop *pY_local;
  WhereLoop *pX_local;
  
  if (((int)((uint)pX->nLTerm - (uint)pX->nSkip) < (int)((uint)pY->nLTerm - (uint)pY->nSkip)) &&
     (pY->nSkip <= pX->nSkip)) {
    if (pY->rRun <= pX->rRun) {
      if (pY->rRun < pX->rRun) {
        return 0;
      }
      if (pY->nOut < pX->nOut) {
        return 0;
      }
    }
    i = (int)pX->nLTerm;
    do {
      do {
        i = i - 1;
        if (i < 0) {
          if (((pX->wsFlags & 0x40) != 0) && ((pY->wsFlags & 0x40) == 0)) {
            return 0;
          }
          return 1;
        }
      } while (pX->aLTerm[i] == (WhereTerm *)0x0);
      j = (int)pY->nLTerm;
      do {
        j = j - 1;
        if (j < 0) break;
      } while (pY->aLTerm[j] != pX->aLTerm[i]);
    } while (-1 < j);
  }
  return 0;
}

Assistant:

static int whereLoopCheaperProperSubset(
  const WhereLoop *pX,       /* First WhereLoop to compare */
  const WhereLoop *pY        /* Compare against this WhereLoop */
){
  int i, j;
  if( pX->nLTerm-pX->nSkip >= pY->nLTerm-pY->nSkip ){
    return 0; /* X is not a subset of Y */
  }
  if( pY->nSkip > pX->nSkip ) return 0;
  if( pX->rRun >= pY->rRun ){
    if( pX->rRun > pY->rRun ) return 0;    /* X costs more than Y */
    if( pX->nOut > pY->nOut ) return 0;    /* X costs more than Y */
  }
  for(i=pX->nLTerm-1; i>=0; i--){
    if( pX->aLTerm[i]==0 ) continue;
    for(j=pY->nLTerm-1; j>=0; j--){
      if( pY->aLTerm[j]==pX->aLTerm[i] ) break;
    }
    if( j<0 ) return 0;  /* X not a subset of Y since term X[i] not used by Y */
  }
  if( (pX->wsFlags&WHERE_IDX_ONLY)!=0 
   && (pY->wsFlags&WHERE_IDX_ONLY)==0 ){
    return 0;  /* Constraint (5) */
  }
  return 1;  /* All conditions meet */
}